

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O0

void __thiscall FBlockLinesIterator::StartBlock(FBlockLinesIterator *this,int x,int y)

{
  int iVar1;
  polyblock_t *local_30;
  int offset;
  int y_local;
  int x_local;
  FBlockLinesIterator *this_local;
  
  this->curx = x;
  this->cury = y;
  if ((((x < 0) || (y < 0)) || (bmapwidth <= x)) || (bmapheight <= y)) {
    this->list = (int *)0x0;
    this->polyLink = (polyblock_t *)0x0;
  }
  else {
    iVar1 = y * bmapwidth + x;
    if (PolyBlockMap == (polyblock_t **)0x0) {
      local_30 = (polyblock_t *)0x0;
    }
    else {
      local_30 = PolyBlockMap[iVar1];
    }
    this->polyLink = local_30;
    this->polyIndex = 0;
    this->list = blockmaplump + (long)blockmap[iVar1] + 1;
  }
  return;
}

Assistant:

void FBlockLinesIterator::StartBlock(int x, int y) 
{ 
	curx = x; 
	cury = y; 
	if (x >= 0 && y >= 0 && x < bmapwidth && y <bmapheight)
	{
		int offset = y*bmapwidth + x;
		polyLink = PolyBlockMap? PolyBlockMap[offset] : NULL;
		polyIndex = 0;

		// There is an extra entry at the beginning of every block.
		// Apparently, id had originally intended for it to be used
		// to keep track of things, but the final code does not do that.
		list = blockmaplump + *(blockmap + offset) + 1;
	}
	else
	{
		// invalid block
		list = NULL;
		polyLink = NULL;
	}
}